

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

InstListIter
mocker::anon_unknown_0::genInst
          (Section *text,FuncSelectionContext *ctx,FunctionModule *func,const_iterator curBBIter,
          const_iterator bbIterEnd,InstListIter curInstIter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  unsigned_long __val;
  _List_node_base *__val_00;
  unsigned_long __val_01;
  uint __line;
  shared_ptr<mocker::ir::Assign> *psVar2;
  shared_ptr<mocker::ir::Reg> *psVar3;
  shared_ptr<mocker::nasm::Addr> *psVar4;
  key_type *pkVar5;
  element_type *peVar6;
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  mapped_type *args_1;
  OpType *pOVar11;
  shared_ptr<mocker::nasm::Register> *psVar12;
  OpType *args;
  char *__function;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<mocker::nasm::Register> *reg;
  key_type *__k;
  shared_ptr<mocker::ir::Jump> p_1;
  shared_ptr<mocker::nasm::Addr> pos;
  shared_ptr<mocker::ir::Reg> irAddr;
  shared_ptr<mocker::ir::Assign> p;
  shared_ptr<mocker::ir::Store> p_2;
  shared_ptr<mocker::ir::Reg> ptrDefined;
  shared_ptr<mocker::ir::Load> load;
  undefined1 local_b8 [16];
  shared_ptr<mocker::ir::ArithBinaryInst> p_4;
  shared_ptr<mocker::ir::ArithBinaryInst> add;
  shared_ptr<mocker::ir::Store> store;
  shared_ptr<mocker::nasm::Addr> local_78;
  shared_ptr<mocker::nasm::MemoryAddr> effectiveAddr;
  int local_54;
  shared_ptr<mocker::ir::IRInst> nextInst;
  shared_ptr<mocker::ir::Reg> addr;
  
  p_Var13 = (bbIterEnd._M_node)->_M_next;
  p_Var15 = bbIterEnd._M_node + 1;
  p_Var14 = (_List_node_base *)(func->identifier)._M_dataplus._M_p;
  ir::dyc<mocker::ir::Comment,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
  if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
LAB_00116192:
    psVar2 = &p;
LAB_00116197:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(psVar2->super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    return (InstListIter)p_Var13;
  }
  ir::dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&irAddr,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
  peVar6 = irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (peVar6 != (element_type *)0x0) {
    return (InstListIter)p_Var13;
  }
  ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
  peVar7 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (peVar7 != (element_type *)0x0) {
    return (InstListIter)p_Var13;
  }
  ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
  if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_1,
               &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)&irAddr,(shared_ptr<mocker::ir::Addr> *)ctx);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)&pos,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Addr> *)&irAddr,&pos);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this = &p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    goto LAB_00116700;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ir::dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&p_1,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
  lVar10 = CONCAT44(p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr._0_4_);
  if (lVar10 == 0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
    if (p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
      if (p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&p_4,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
        if (p_4.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_4.
                      super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&load,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
          if (load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (p_Var14 == curBBIter._M_node) {
              p_Var14 = (_List_node_base *)0xffffffffffffffff;
            }
            else {
              p_Var14 = p_Var14[1]._M_next;
            }
            ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&irAddr,(shared_ptr<mocker::ir::IRInst> *)(p_Var13 + 1));
            if (irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar8 = false;
            }
            else {
              std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&p_1,
                         &((load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Definition).dest.
                          super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
              ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&pos);
              if (((pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) ||
                  (bVar8 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(pos.
                                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + 1),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(CONCAT44(p_1.
                                                  super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  p_1.
                                                  super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_) + 8)), bVar8)) ||
                 (((_List_node_base *)
                   irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                   super_Addr._vptr_Addr[1] != p_Var14 &&
                  (*(_List_node_base **)
                    (irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].identifier._M_string_length + 8) != p_Var14)))) {
                bVar8 = false;
              }
              else {
                DefUseChain::getUses
                          ((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                            *)&p,&ctx->defUse,(shared_ptr<mocker::ir::Reg> *)&p_1);
                bVar8 = (ulong)(((long)p.
                                       super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi -
                                (long)p.
                                      super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr) / 0x18) < 2;
                std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>::
                ~vector((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                         *)&p);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            FuncSelectionContext::getIrAddr
                      ((FuncSelectionContext *)&p_1,(shared_ptr<mocker::ir::Addr> *)ctx);
            std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                      ((shared_ptr<mocker::nasm::Addr> *)&p);
            peVar7 = p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (peVar7 == (element_type *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&p,"",(allocator<char> *)&pos);
              FuncSelectionContext::newVirtualReg((FuncSelectionContext *)&irAddr,(string *)ctx);
              std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_1,
                         (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)&irAddr
                        );
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__cxx11::string::~string((string *)&p);
              FuncSelectionContext::getIrAddr
                        ((FuncSelectionContext *)&p,(shared_ptr<mocker::ir::Addr> *)ctx);
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                        (text,(shared_ptr<mocker::nasm::Addr> *)&p_1,
                         (shared_ptr<mocker::nasm::Addr> *)&p);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            FuncSelectionContext::getIrAddr
                      ((FuncSelectionContext *)&pos,(shared_ptr<mocker::ir::Addr> *)ctx);
            std::dynamic_pointer_cast<mocker::nasm::LabelAddr,mocker::nasm::Addr>
                      ((shared_ptr<mocker::nasm::Addr> *)&p);
            if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              __assert_fail("!nasm::dyc<nasm::LabelAddr>(rhs)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                            ,0xde,
                            "bool mocker::(anonymous namespace)::genRelation(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::RelationInst> &, const std::shared_ptr<ir::IRInst> &, std::size_t)"
                           );
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            nasm::Section::
            emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                      (text,(shared_ptr<mocker::nasm::Addr> *)&p_1,&pos);
            if (bVar8) {
              if (((anonymous_namespace)::
                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                   ::Jump2ThenMap == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                               ::Jump2ThenMap), iVar9 != 0)) {
                p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
                irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
                irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&p;
                SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::SmallMap
                          ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                            *)(anonymous_namespace)::
                              genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                              ::Jump2ThenMap,
                           (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>_>
                            *)&irAddr);
                __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                             ::~SmallMap,
                             (anonymous_namespace)::
                             genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                             ::Jump2ThenMap,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                     ::Jump2ThenMap);
              }
              if (((anonymous_namespace)::
                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                   ::Jump2ElseMap == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                               ::Jump2ElseMap), iVar9 != 0)) {
                p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x100000000;
                p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
                irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&p;
                SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::SmallMap
                          ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                            *)(anonymous_namespace)::
                              genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                              ::Jump2ElseMap,
                           (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>_>
                            *)&irAddr);
                __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                             ::~SmallMap,
                             (anonymous_namespace)::
                             genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                             ::Jump2ElseMap,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                     ::Jump2ElseMap);
              }
              ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)(p_Var13 + 1));
              if (*(_List_node_base **)
                   &(((p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->val).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count == p_Var14) {
                store.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
                     = *(undefined4 *)
                        &((load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->addr).
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                pOVar11 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::
                          at((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                              *)(anonymous_namespace)::
                                genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                ::Jump2ElseMap,(OpType *)&store);
                std::__cxx11::to_string
                          ((string *)&irAddr,
                           *(unsigned_long *)
                            (*(long *)&p_2.
                                       super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr[1].super_IRInst.type + 8));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,".L",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&irAddr);
                std::make_shared<mocker::nasm::Label,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ptrDefined);
                nasm::Section::
                emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType_const&,std::shared_ptr<mocker::nasm::Label>>
                          (text,pOVar11,(shared_ptr<mocker::nasm::Label> *)&ptrDefined);
              }
              else {
                store.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
                     = *(undefined4 *)
                        &((load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->addr).
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                pOVar11 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::
                          at((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                              *)(anonymous_namespace)::
                                genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                ::Jump2ThenMap,(OpType *)&store);
                p_Var1 = ((p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->val).
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                __val._0_4_ = p_Var1->_M_use_count;
                __val._4_4_ = p_Var1->_M_weak_count;
                std::__cxx11::to_string((string *)&irAddr,__val);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,".L",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&irAddr);
                std::make_shared<mocker::nasm::Label,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ptrDefined);
                nasm::Section::
                emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType_const&,std::shared_ptr<mocker::nasm::Label>>
                          (text,pOVar11,(shared_ptr<mocker::nasm::Label> *)&ptrDefined);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&ptrDefined.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::__cxx11::string::~string((string *)&p);
              std::__cxx11::string::~string((string *)&irAddr);
              psVar3 = (shared_ptr<mocker::ir::Reg> *)&p_2;
            }
            else {
              std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<mocker::ir::Reg,void>
                        ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&p_2,
                         &((load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Definition).dest.
                          super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
              FuncSelectionContext::getIrAddr
                        ((FuncSelectionContext *)&p,(shared_ptr<mocker::ir::Addr> *)ctx);
              std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                        ((shared_ptr<mocker::nasm::Addr> *)&irAddr);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   ((ulong)p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_ << 0x20);
              std::make_shared<mocker::nasm::NumericConstant,int>((int *)&p);
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::NumericConstant>>
                        (text,(shared_ptr<mocker::nasm::Register> *)&irAddr,
                         (shared_ptr<mocker::nasm::NumericConstant> *)&p);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (((anonymous_namespace)::
                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                   ::mp == '\0') &&
                 (iVar9 = __cxa_guard_acquire(&(anonymous_namespace)::
                                               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                               ::mp), iVar9 != 0)) {
                p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
                p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
                p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&p;
                SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::SmallMap
                          ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType> *)
                           (anonymous_namespace)::
                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                           ::mp,(initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>_>
                                 *)&p_2);
                __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::
                             ~SmallMap,
                             (anonymous_namespace)::
                             genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                             ::mp,&__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::
                                     genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                     ::mp);
              }
              psVar12 = nasm::rax();
              p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   ((ulong)p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr & 0xffffffff00000000);
              std::make_shared<mocker::nasm::NumericConstant,int>((int *)&p);
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                        (text,psVar12,(shared_ptr<mocker::nasm::NumericConstant> *)&p);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   CONCAT44(p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,
                            *(undefined4 *)
                             &((load.
                                super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->addr).
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
              args = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::at
                               ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>
                                 *)(anonymous_namespace)::
                                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                   ::mp,(OpType *)&p);
              psVar12 = nasm::rax();
              nasm::Section::
              emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType_const&,std::shared_ptr<mocker::nasm::Register>const&>
                        (text,args,psVar12);
              psVar12 = nasm::rax();
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                        (text,(shared_ptr<mocker::nasm::Register> *)&irAddr,psVar12);
              psVar3 = &irAddr;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&(psVar3->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (bVar8) {
              p_Var13 = p_Var13->_M_next;
            }
            this = &load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
            goto LAB_00116700;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&p_2,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
          if (p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (p_Var14 == curBBIter._M_node) {
              p_Var14 = (_List_node_base *)0xffffffffffffffff;
            }
            else {
              p_Var14 = p_Var14[1]._M_next;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&p,"",(allocator<char> *)&irAddr);
            FuncSelectionContext::newVirtualReg((FuncSelectionContext *)&p_1,(string *)ctx);
            std::__cxx11::string::~string((string *)&p);
            FuncSelectionContext::getIrAddr
                      ((FuncSelectionContext *)&p,(shared_ptr<mocker::ir::Addr> *)ctx);
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                      (text,(shared_ptr<mocker::nasm::Register> *)&p_1,
                       (shared_ptr<mocker::nasm::Addr> *)&p);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 ((ulong)irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_ << 0x20);
            std::make_shared<mocker::nasm::NumericConstant,int>((int *)&p);
            nasm::Section::
            emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::NumericConstant>>
                      (text,(shared_ptr<mocker::nasm::Register> *)&p_1,
                       (shared_ptr<mocker::nasm::NumericConstant> *)&p);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            p_Var15 = *(_List_node_base **)
                       &(((p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->val).
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count;
            if (p_Var15 == p_Var14) {
              ptrDefined.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _0_4_ = 0;
              std::__cxx11::to_string
                        ((string *)&irAddr,
                         *(unsigned_long *)
                          (*(long *)&p_2.
                                     super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr[1].super_IRInst.type + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p
                             ,".L",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&irAddr);
              std::make_shared<mocker::nasm::Label,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
              nasm::Section::
              emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                        (text,(OpType *)&ptrDefined,(shared_ptr<mocker::nasm::Label> *)&pos);
            }
            else {
              __val_00 = *(_List_node_base **)
                          (*(long *)&p_2.
                                     super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr[1].super_IRInst.type + 8);
              if (__val_00 == p_Var14) {
                ptrDefined.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _0_4_ = 1;
                std::__cxx11::to_string((string *)&irAddr,(unsigned_long)p_Var15);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,".L",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&irAddr);
                std::make_shared<mocker::nasm::Label,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos
                          );
                nasm::Section::
                emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                          (text,(OpType *)&ptrDefined,(shared_ptr<mocker::nasm::Label> *)&pos);
              }
              else {
                ptrDefined.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _0_4_ = 0;
                std::__cxx11::to_string((string *)&irAddr,(unsigned_long)__val_00);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,".L",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&irAddr);
                std::make_shared<mocker::nasm::Label,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos
                          );
                nasm::Section::
                emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                          (text,(OpType *)&ptrDefined,(shared_ptr<mocker::nasm::Label> *)&pos);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::string::~string((string *)&p);
                std::__cxx11::string::~string((string *)&irAddr);
                p_Var1 = ((p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->val).
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                __val_01._0_4_ = p_Var1->_M_use_count;
                __val_01._4_4_ = p_Var1->_M_weak_count;
                std::__cxx11::to_string((string *)&irAddr,__val_01);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &p,".L",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&irAddr);
                std::make_shared<mocker::nasm::Label,std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos
                          );
                nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
                          (text,(shared_ptr<mocker::nasm::Label> *)&pos);
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__cxx11::string::~string((string *)&p);
            std::__cxx11::string::~string((string *)&irAddr);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            psVar2 = (shared_ptr<mocker::ir::Assign> *)&p_2;
            goto LAB_00116197;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ir::dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
          if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
            if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              ir::dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>const&>
                        ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
              if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                          ((ir *)&p,(shared_ptr<mocker::ir::IRInst> *)p_Var15);
                if (p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                                ,0x1e7,
                                "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                               );
                }
                std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::ir::Reg,void>
                          ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&pos,
                           &((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->super_Definition).dest.
                            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                FuncSelectionContext::getIrAddr
                          ((FuncSelectionContext *)&p_1,(shared_ptr<mocker::ir::Addr> *)ctx);
                std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                          ((shared_ptr<mocker::nasm::Addr> *)&irAddr);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  __assert_fail("dest",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                                ,0x1df,
                                "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                               );
                }
                FuncSelectionContext::getIrAddr
                          ((FuncSelectionContext *)&p_1,(shared_ptr<mocker::ir::Addr> *)ctx);
                nasm::Section::
                emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                          (text,(shared_ptr<mocker::nasm::Register> *)&irAddr,
                           (shared_ptr<mocker::nasm::Addr> *)&p_1);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (*(int *)&((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->operand).
                             super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    == 0) {
                  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
                       = 0;
                  nasm::Section::
                  emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                            (text,(OpType *)&p_1,(shared_ptr<mocker::nasm::Register> *)&irAddr);
                }
                else {
                  p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
                       = 1;
                  nasm::Section::
                  emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                            (text,(OpType *)&p_1,(shared_ptr<mocker::nasm::Register> *)&irAddr);
                }
              }
              else {
                std::
                make_shared<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>const&,char_const(&)[8],std::shared_ptr<mocker::ir::Addr>const&>
                          (&irAddr,(char (*) [8])
                                   &((p.
                                      super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super_Definition).dest,
                           (shared_ptr<mocker::ir::Addr> *)"__alloc");
                genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)&irAddr);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)&p);
            }
          }
          else {
            if (((p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              FuncSelectionContext::getIrAddr
                        ((FuncSelectionContext *)&irAddr,(shared_ptr<mocker::ir::Addr> *)ctx);
              psVar12 = nasm::rax();
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                        (text,psVar12,(shared_ptr<mocker::nasm::Addr> *)&irAddr);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            pkVar5 = DAT_001f42f8;
            for (__k = (anonymous_namespace)::CalleeSave; __k != pkVar5; __k = __k + 1) {
              args_1 = std::__detail::
                       _Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::at((_Map_base<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&ctx->pRegAddr,__k);
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>const&>
                        (text,__k,args_1);
            }
            nasm::Section::emplaceInst<mocker::nasm::Leave>(text);
            nasm::Section::emplaceInst<mocker::nasm::Ret>(text);
          }
          goto LAB_00116192;
        }
        std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&nextInst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)(p_Var13 + 1));
        ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>&>
                  ((ir *)&add,
                   (shared_ptr<mocker::ir::IRInst> *)
                   &nextInst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>);
        if (add.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          genArithBinary(text,ctx,&p_4);
        }
        else {
          if ((p_4.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->op == Shl) {
            p_Var14 = p_Var13->_M_next;
            std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
                      ((shared_ptr<mocker::ir::Addr> *)&irAddr);
            if ((irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                 (element_type *)0x0) ||
               (((irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                identifier)._M_dataplus._M_p != (pointer)0x3)) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)&p_1,
                         &((p_4.
                            super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_Definition).dest.
                          super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
              DefUseChain::getUses
                        ((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                          *)&p,&ctx->defUse,(shared_ptr<mocker::ir::Reg> *)&p_1);
              lVar10 = (long)p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi -
                       (long)p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
              std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>::
              ~vector((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_> *
                      )&p);
              if ((ulong)(lVar10 / 0x18) < 2) {
                FuncSelectionContext::getIrAddr
                          ((FuncSelectionContext *)&pos,(shared_ptr<mocker::ir::Addr> *)ctx);
                if ((add.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->op == Add) {
                  ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&p_2);
                  if ((p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       == (element_type *)0x0) ||
                     (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (CONCAT44(p_1.
                                        super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._4_4_,
                                        p_1.
                                        super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr._0_4_) + 8), bVar8 = std::operator!=(__lhs,__lhs),
                     bVar8)) {
                    bVar8 = false;
                  }
                  else {
                    std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                              (&ptrDefined.
                                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>,
                               &((add.
                                  super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_Definition).dest.
                                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                    DefUseChain::getUses
                              ((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                                *)&p,&ctx->defUse,
                               (shared_ptr<mocker::ir::Reg> *)
                               &ptrDefined.
                                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
                    lVar10 = (long)p.
                                   super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi -
                             (long)p.
                                   super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr;
                    std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                    ::~vector((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                               *)&p);
                    if ((ulong)(lVar10 / 0x18) < 2) {
                      FuncSelectionContext::getIrAddr
                                ((FuncSelectionContext *)&p,(shared_ptr<mocker::ir::Addr> *)ctx);
                      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                                ((ir *)&load,(shared_ptr<mocker::ir::IRInst> *)(p_Var14 + 1));
                      ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                                ((ir *)&store,(shared_ptr<mocker::ir::IRInst> *)(p_Var14 + 1));
                      if ((CONCAT44(store.
                                    super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    store.
                                    super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._0_4_) == 0) &&
                         (load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr == (element_type *)0x0)) {
                        bVar8 = false;
                      }
                      else {
                        std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>
                                  ((shared_ptr<mocker::ir::Addr> *)&addr);
                        bVar8 = std::operator!=(&(addr.
                                                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->identifier,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(CONCAT44(ptrDefined.
                                                                                                                          
                                                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._4_4_,
                                                  ptrDefined.
                                                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr._0_4_) + 8));
                        if (!bVar8) {
                          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                                    ((shared_ptr<mocker::nasm::Addr> *)local_b8);
                          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
                                    (&local_78);
                          local_54 = 8;
                          std::
                          make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,int,int>
                                    ((shared_ptr<mocker::nasm::Register> *)&effectiveAddr,
                                     (shared_ptr<mocker::nasm::Register> *)local_b8,(int *)&local_78
                                     ,&local_54);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&local_78.
                                      super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
                          if (load.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr == (element_type *)0x0) {
                            FuncSelectionContext::getIrAddr
                                      ((FuncSelectionContext *)local_b8,
                                       (shared_ptr<mocker::ir::Addr> *)ctx);
                            nasm::Section::
                            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>>
                                      (text,&effectiveAddr,
                                       (shared_ptr<mocker::nasm::Addr> *)local_b8);
                            psVar4 = (shared_ptr<mocker::nasm::Addr> *)local_b8;
                          }
                          else {
                            std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr<mocker::ir::Reg,void>
                                      ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)
                                       &local_78,
                                       &((load.
                                          super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_Definition).dest.
                                        super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                      );
                            FuncSelectionContext::getIrAddr
                                      ((FuncSelectionContext *)local_b8,
                                       (shared_ptr<mocker::ir::Addr> *)ctx);
                            nasm::Section::
                            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::MemoryAddr>&>
                                      (text,(shared_ptr<mocker::nasm::Addr> *)local_b8,
                                       &effectiveAddr);
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8))
                            ;
                            psVar4 = &local_78;
                          }
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&(psVar4->
                                      super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_refcount);
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                    (&effectiveAddr.
                                      super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                        bVar8 = !bVar8;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&addr.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                      }
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&store.
                                  super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&load.
                                  super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&p.
                                  super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                    else {
                      bVar8 = false;
                    }
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&ptrDefined.
                                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                  }
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  if (bVar8) {
                    p_Var13 = p_Var13->_M_next->_M_next;
                    goto LAB_00117035;
                  }
                  goto LAB_00117022;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
          }
LAB_00117022:
          genArithBinary(text,ctx,&p_4);
        }
LAB_00117035:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&add.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&nextInst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this = &p_4.super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        goto LAB_00116700;
      }
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&irAddr,
                 (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)
                 &((p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  addr).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)&p,(shared_ptr<mocker::ir::Addr> *)ctx);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>
                ((shared_ptr<mocker::ir::Addr> *)&irAddr);
      if (irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __function = 
        "void mocker::(anonymous namespace)::genLoad(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::Load> &)"
        ;
        __line = 0x71;
        goto LAB_0011749c;
      }
      ir::dycGlobalReg((shared_ptr<mocker::ir::Addr> *)&p_1);
      if (CONCAT44(p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                   ,p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _0_4_) != 0) {
        makeLabelAddr((anon_unknown_0 *)&pos,(shared_ptr<mocker::ir::Reg> *)&p_1);
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::LabelAddr>>
                  (text,(shared_ptr<mocker::nasm::Addr> *)&p,
                   (shared_ptr<mocker::nasm::LabelAddr> *)&pos);
        goto LAB_001164ff;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      FuncSelectionContext::buildMemAddr
                ((FuncSelectionContext *)&p_1,(shared_ptr<mocker::ir::Reg> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::MemoryAddr>>
                (text,(shared_ptr<mocker::nasm::Addr> *)&p,
                 (shared_ptr<mocker::nasm::MemoryAddr> *)&p_1);
    }
    else {
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)&p,(shared_ptr<mocker::ir::Addr> *)ctx);
      std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>
                ((shared_ptr<mocker::ir::Addr> *)&irAddr);
      if (irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __function = 
        "void mocker::(anonymous namespace)::genStore(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::Store> &)"
        ;
        __line = 0x65;
LAB_0011749c:
        __assert_fail("irAddr",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                      ,__line,__function);
      }
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&pos,
                 &irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      ir::dycGlobalReg((shared_ptr<mocker::ir::Addr> *)&p_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      if (CONCAT44(p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                   ,p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _0_4_) == 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        FuncSelectionContext::buildMemAddr
                  ((FuncSelectionContext *)&p_1,(shared_ptr<mocker::ir::Reg> *)ctx);
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,(shared_ptr<mocker::nasm::MemoryAddr> *)&p_1,
                   (shared_ptr<mocker::nasm::Addr> *)&p);
      }
      else {
        makeLabelAddr((anon_unknown_0 *)&pos,(shared_ptr<mocker::ir::Reg> *)&p_1);
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::LabelAddr>,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,(shared_ptr<mocker::nasm::LabelAddr> *)&pos,
                   (shared_ptr<mocker::nasm::Addr> *)&p);
LAB_001164ff:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&irAddr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Assign,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this = &p_2.super___shared_ptr<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    goto LAB_00116700;
  }
  if (p_Var14 == curBBIter._M_node) {
    p_Var15 = *(_List_node_base **)(*(long *)(lVar10 + 0x18) + 8);
LAB_001163cd:
    std::__cxx11::to_string((string *)&irAddr,(unsigned_long)p_Var15);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,".L",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&irAddr);
    std::make_shared<mocker::nasm::Label,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos);
    nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
              (text,(shared_ptr<mocker::nasm::Label> *)&pos);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pos.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)&irAddr);
  }
  else {
    p_Var15 = *(_List_node_base **)(*(long *)(lVar10 + 0x18) + 8);
    if (p_Var14[1]._M_next != p_Var15) goto LAB_001163cd;
  }
  this = &p_1.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_00116700:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
  return (InstListIter)p_Var13;
}

Assistant:

ir::InstListIter genInst(nasm::Section &text, FuncSelectionContext &ctx,
                         const ir::FunctionModule &func,
                         ir::BasicBlockList::const_iterator curBBIter,
                         ir::BasicBlockList::const_iterator bbIterEnd,
                         ir::InstListIter curInstIter) {
  auto &inst = *curInstIter;
  auto nextIter = curInstIter;
  ++nextIter;
  auto nextBBIter = curBBIter;
  ++nextBBIter;

  if (ir::dyc<ir::Comment>(inst) || ir::dyc<ir::AttachedComment>(inst))
    return nextIter;

  if (ir::dyc<ir::Phi>(inst))
    return nextIter;

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    text.emplaceInst<nasm::Mov>(ctx.getIrAddr(p->getDest()),
                                ctx.getIrAddr(p->getOperand()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Jump>(inst)) {
    if (nextBBIter == bbIterEnd ||
        nextBBIter->getLabelID() != p->getLabel()->getID())
      text.emplaceInst<nasm::Jmp>(std::make_shared<nasm::Label>(
          ".L" + std::to_string(p->getLabel()->getID())));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Store>(inst)) {
    genStore(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Load>(inst)) {
    genLoad(text, ctx, p);
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    auto nextInst = *nextIter;
    auto add = ir::dyc<ir::ArithBinaryInst>(nextInst);
    if (!add) {
      genArithBinary(text, ctx, p);
      return nextIter;
    }
    auto nextNextIter = nextIter;
    ++nextNextIter;
    if (tryCombineMemInst(text, ctx, p, add, *nextNextIter)) {
      ++nextIter;
      ++nextIter;
    } else {
      genArithBinary(text, ctx, p);
    }
    return nextIter;
  }

  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    auto skip =
        genRelation(text, ctx, p, *nextIter,
                    nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    if (skip)
      ++nextIter;
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Branch>(inst)) {
    genBranch(text, ctx, p,
              nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Ret>(inst)) {
    if (p->getVal()) {
      auto val = ctx.getIrAddr(p->getVal());
      text.emplaceInst<nasm::Mov>(nasm::rax(), val);
    }
    for (auto &reg : CalleeSave) {
      text.emplaceInst<nasm::Mov>(reg, ctx.getPRegAddr(reg));
    }
    text.emplaceInst<nasm::Leave>();
    text.emplaceInst<nasm::Ret>();
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Call>(inst)) {
    genCall(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Malloc>(inst)) {
    genCall(text, ctx,
            std::make_shared<ir::Call>(p->getDest(), "__alloc", p->getSize()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    auto dest = nasm::dyc<nasm::Register>(ctx.getIrAddr(p->getDest()));
    assert(dest);
    text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(p->getOperand()));
    if (p->getOp() == ir::ArithUnaryInst::Neg)
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Neg, dest);
    else
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Not, dest);
    return nextIter;
  }
  assert(false);
}